

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall cmQtAutoMocUic::CreateDirectories(cmQtAutoMocUic *this)

{
  bool bVar1;
  BaseSettingsT *pBVar2;
  Logger *this_00;
  allocator<char> local_39;
  string local_38;
  cmQtAutoMocUic *local_18;
  cmQtAutoMocUic *this_local;
  
  local_18 = this;
  pBVar2 = BaseConst(this);
  bVar1 = cmsys::SystemTools::MakeDirectory(&pBVar2->AutogenIncludeDir,(mode_t *)0x0);
  if (!bVar1) {
    this_00 = Log(this);
    pBVar2 = BaseConst(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Could not create directory.",&local_39);
    cmQtAutoGenerator::Logger::ErrorFile(this_00,GEN,&pBVar2->AutogenIncludeDir,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return bVar1;
}

Assistant:

bool cmQtAutoMocUic::CreateDirectories()
{
  // Create AUTOGEN include directory
  if (!cmSystemTools::MakeDirectory(BaseConst().AutogenIncludeDir)) {
    Log().ErrorFile(GenT::GEN, BaseConst().AutogenIncludeDir,
                    "Could not create directory.");
    return false;
  }
  return true;
}